

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

timer_thread_unique_ptr_t __thiscall
so_5::create_timer_heap_thread(so_5 *this,error_logger_shptr_t *logger)

{
  error_logger_shptr_t local_18;
  
  local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (logger->super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  create_timer_heap_thread(this,&local_18,0x40);
  if (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
          )(__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
            )this;
}

Assistant:

SO_5_FUNC timer_thread_unique_ptr_t
create_timer_heap_thread(
	error_logger_shptr_t logger )
	{
		using timertt_thread_t = timers_details::timer_heap_thread_t;

		return create_timer_heap_thread(
				logger,
				timertt_thread_t::default_initial_heap_capacity() );
	}